

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O3

void __thiscall scheduler_tests::wait_until_past::test_method(wait_until_past *this)

{
  cv_status cVar1;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  Mutex mtx;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  condition_variable condvar;
  check_type cVar5;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  lazy_ostream local_100;
  undefined1 *local_f0;
  char **local_e8;
  assertion_result local_e0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  __native_type local_a8;
  unique_lock<std::mutex> local_78;
  condition_variable local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::condition_variable::condition_variable(local_68);
  local_78._M_device = (mutex_type *)&local_a8;
  local_a8._16_8_ = 0;
  local_a8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_a8.__align = 0;
  local_a8._8_8_ = 0;
  local_a8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_78._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_78);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x77;
  file.m_begin = (iterator)&local_b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c8,msg);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_100._vptr_lazy_ostream = (_func_int **)(lVar2 + -1000000000);
  cVar1 = std::condition_variable::
          __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (local_68,&local_78,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     &local_100);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 == timeout);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "std::cv_status::timeout == no_wait(std::chrono::seconds{1})";
  local_108 = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_118 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_100,1,0,WARN,_cVar5,(size_t)&local_120,0x77);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x78;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_100._vptr_lazy_ostream = (_func_int **)(lVar2 + -60000000000);
  cVar1 = std::condition_variable::
          __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (local_68,&local_78,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     &local_100);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 == timeout);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "std::cv_status::timeout == no_wait(std::chrono::minutes{1})";
  local_108 = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_148 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_100,1,0,WARN,_cVar5,(size_t)&local_150,0x78);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x79;
  file_01.m_begin = (iterator)&local_160;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
             msg_01);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_100._vptr_lazy_ostream = (_func_int **)(lVar2 + -3600000000000);
  cVar1 = std::condition_variable::
          __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (local_68,&local_78,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     &local_100);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 == timeout);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "std::cv_status::timeout == no_wait(std::chrono::hours{1})";
  local_108 = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_178 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_100,1,0,WARN,_cVar5,(size_t)&local_180,0x79);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x7a;
  file_02.m_begin = (iterator)&local_190;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
             msg_02);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_100._vptr_lazy_ostream = (_func_int **)(lVar2 + -36000000000000);
  cVar1 = std::condition_variable::
          __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (local_68,&local_78,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     &local_100);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 == timeout);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "std::cv_status::timeout == no_wait(std::chrono::hours{10})";
  local_108 = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_100,1,0,WARN,_cVar5,(size_t)&local_1b0,0x7a);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x7b;
  file_03.m_begin = (iterator)&local_1c0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d0,
             msg_03);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_100._vptr_lazy_ostream = (_func_int **)(lVar2 + -360000000000000);
  cVar1 = std::condition_variable::
          __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (local_68,&local_78,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     &local_100);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 == timeout);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "std::cv_status::timeout == no_wait(std::chrono::hours{100})";
  local_108 = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_100,1,0,WARN,_cVar5,(size_t)&local_1e0,0x7b);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7c;
  file_04.m_begin = (iterator)&local_1f0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_200,
             msg_04);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_100._vptr_lazy_ostream = (_func_int **)(lVar2 + -3600000000000000);
  cVar1 = std::condition_variable::
          __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (local_68,&local_78,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     &local_100);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 == timeout);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "std::cv_status::timeout == no_wait(std::chrono::hours{1000})";
  local_108 = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_100,1,0,WARN,0xecb9d4,(size_t)&stack0xfffffffffffffdf0,0x7c);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  std::unique_lock<std::mutex>::~unique_lock(&local_78);
  std::condition_variable::~condition_variable(local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(wait_until_past)
{
    std::condition_variable condvar;
    Mutex mtx;
    WAIT_LOCK(mtx, lock);

    const auto no_wait = [&](const std::chrono::seconds& d) {
        return condvar.wait_until(lock, std::chrono::steady_clock::now() - d);
    };

    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::seconds{1}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::minutes{1}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{1}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{10}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{100}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{1000}));
}